

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O2

void set_suffix(void)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  
  pcVar4 = modprefix;
  sVar3 = strlen(modprefix);
  pcVar1 = mechname;
  do {
    if (sVar3 == 0) {
LAB_001046a0:
      modbase = pcVar4;
      if (mechname == (char *)0x0) {
        sprintf(suffix,"_%s",pcVar4);
        mechname = modbase;
      }
      else {
        iVar2 = strcmp(mechname,"nothing");
        if (iVar2 != 0) {
          sprintf(suffix,"_%s",pcVar1);
          return;
        }
        vectorize = 0;
        suffix[0] = '\0';
        mechname = pcVar4;
      }
      return;
    }
    if ((pcVar4[sVar3] == '\\') || (pcVar4[sVar3] == '/')) {
      pcVar4 = pcVar4 + sVar3 + 1;
      goto LAB_001046a0;
    }
    sVar3 = sVar3 - 1;
  } while( true );
}

Assistant:

void set_suffix() {
	for (modbase = modprefix + strlen(modprefix); modbase != modprefix;
	    modbase--) {
		if (*modbase == '\\' || *modbase == '/') {
			modbase++;
			break;
		}
	}
	if (!mechname) {
		sprintf(suffix,"_%s", modbase);
		mechname = modbase;
	} else if (strcmp(mechname, "nothing") == 0) {
		vectorize = 0;
		suffix[0] = '\0';
		mechname = modbase;
	}else{
		sprintf(suffix, "_%s", mechname);
	}
}